

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmELF.cxx
# Opt level: O1

void __thiscall
cmELFInternalImpl<cmELFTypes64>::ByteSwap
          (cmELFInternalImpl<cmELFTypes64> *this,ELF_Shdr *sec_header)

{
  ushort *puVar1;
  undefined1 uVar2;
  ushort uVar3;
  ushort uVar4;
  Elf64_Word EVar5;
  Elf64_Addr EVar6;
  Elf64_Off EVar7;
  Elf64_Xword EVar8;
  
  EVar5 = sec_header->sh_name;
  *(undefined1 *)&sec_header->sh_name = *(undefined1 *)((long)&sec_header->sh_name + 3);
  *(char *)((long)&sec_header->sh_name + 3) = (char)EVar5;
  puVar1 = (ushort *)((long)&sec_header->sh_name + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar5 = sec_header->sh_type;
  *(undefined1 *)&sec_header->sh_type = *(undefined1 *)((long)&sec_header->sh_type + 3);
  *(char *)((long)&sec_header->sh_type + 3) = (char)EVar5;
  puVar1 = (ushort *)((long)&sec_header->sh_type + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  uVar3 = (ushort)sec_header->sh_flags;
  uVar4 = *(ushort *)((long)&sec_header->sh_flags + 6);
  *(ushort *)&sec_header->sh_flags = uVar4 << 8 | uVar4 >> 8;
  *(ushort *)((long)&sec_header->sh_flags + 6) = uVar3 << 8 | uVar3 >> 8;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_flags + 2);
  *(undefined1 *)((long)&sec_header->sh_flags + 2) =
       *(undefined1 *)((long)&sec_header->sh_flags + 5);
  *(undefined1 *)((long)&sec_header->sh_flags + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_flags + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar6 = sec_header->sh_addr;
  *(undefined1 *)&sec_header->sh_addr = *(undefined1 *)((long)&sec_header->sh_addr + 7);
  *(char *)((long)&sec_header->sh_addr + 7) = (char)EVar6;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_addr + 1);
  *(undefined1 *)((long)&sec_header->sh_addr + 1) = *(undefined1 *)((long)&sec_header->sh_addr + 6);
  *(undefined1 *)((long)&sec_header->sh_addr + 6) = uVar2;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_addr + 2);
  *(undefined1 *)((long)&sec_header->sh_addr + 2) = *(undefined1 *)((long)&sec_header->sh_addr + 5);
  *(undefined1 *)((long)&sec_header->sh_addr + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_addr + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar7 = sec_header->sh_offset;
  *(undefined1 *)&sec_header->sh_offset = *(undefined1 *)((long)&sec_header->sh_offset + 7);
  *(char *)((long)&sec_header->sh_offset + 7) = (char)EVar7;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_offset + 1);
  *(undefined1 *)((long)&sec_header->sh_offset + 1) =
       *(undefined1 *)((long)&sec_header->sh_offset + 6);
  *(undefined1 *)((long)&sec_header->sh_offset + 6) = uVar2;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_offset + 2);
  *(undefined1 *)((long)&sec_header->sh_offset + 2) =
       *(undefined1 *)((long)&sec_header->sh_offset + 5);
  *(undefined1 *)((long)&sec_header->sh_offset + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_offset + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar8 = sec_header->sh_size;
  *(undefined1 *)&sec_header->sh_size = *(undefined1 *)((long)&sec_header->sh_size + 7);
  *(char *)((long)&sec_header->sh_size + 7) = (char)EVar8;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_size + 1);
  *(undefined1 *)((long)&sec_header->sh_size + 1) = *(undefined1 *)((long)&sec_header->sh_size + 6);
  *(undefined1 *)((long)&sec_header->sh_size + 6) = uVar2;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_size + 2);
  *(undefined1 *)((long)&sec_header->sh_size + 2) = *(undefined1 *)((long)&sec_header->sh_size + 5);
  *(undefined1 *)((long)&sec_header->sh_size + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_size + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar5 = sec_header->sh_link;
  *(undefined1 *)&sec_header->sh_link = *(undefined1 *)((long)&sec_header->sh_link + 3);
  *(char *)((long)&sec_header->sh_link + 3) = (char)EVar5;
  puVar1 = (ushort *)((long)&sec_header->sh_link + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar5 = sec_header->sh_info;
  *(undefined1 *)&sec_header->sh_info = *(undefined1 *)((long)&sec_header->sh_info + 3);
  *(char *)((long)&sec_header->sh_info + 3) = (char)EVar5;
  puVar1 = (ushort *)((long)&sec_header->sh_info + 1);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar8 = sec_header->sh_addralign;
  *(undefined1 *)&sec_header->sh_addralign = *(undefined1 *)((long)&sec_header->sh_addralign + 7);
  *(char *)((long)&sec_header->sh_addralign + 7) = (char)EVar8;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_addralign + 1);
  *(undefined1 *)((long)&sec_header->sh_addralign + 1) =
       *(undefined1 *)((long)&sec_header->sh_addralign + 6);
  *(undefined1 *)((long)&sec_header->sh_addralign + 6) = uVar2;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_addralign + 2);
  *(undefined1 *)((long)&sec_header->sh_addralign + 2) =
       *(undefined1 *)((long)&sec_header->sh_addralign + 5);
  *(undefined1 *)((long)&sec_header->sh_addralign + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_addralign + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  EVar8 = sec_header->sh_entsize;
  *(undefined1 *)&sec_header->sh_entsize = *(undefined1 *)((long)&sec_header->sh_entsize + 7);
  *(char *)((long)&sec_header->sh_entsize + 7) = (char)EVar8;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_entsize + 1);
  *(undefined1 *)((long)&sec_header->sh_entsize + 1) =
       *(undefined1 *)((long)&sec_header->sh_entsize + 6);
  *(undefined1 *)((long)&sec_header->sh_entsize + 6) = uVar2;
  uVar2 = *(undefined1 *)((long)&sec_header->sh_entsize + 2);
  *(undefined1 *)((long)&sec_header->sh_entsize + 2) =
       *(undefined1 *)((long)&sec_header->sh_entsize + 5);
  *(undefined1 *)((long)&sec_header->sh_entsize + 5) = uVar2;
  puVar1 = (ushort *)((long)&sec_header->sh_entsize + 3);
  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
  return;
}

Assistant:

void cmELFByteSwap(char* data, cmELFByteSwapSize<4> /*unused*/)
{
  char one_byte;
  one_byte = data[0];
  data[0] = data[3];
  data[3] = one_byte;
  one_byte = data[1];
  data[1] = data[2];
  data[2] = one_byte;
}